

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove.c
# Opt level: O2

int remove(char *__filename)

{
  _PDCLIB_file_t *p_Var1;
  int iVar2;
  int *piVar3;
  _PDCLIB_file_t **pp_Var4;
  
  pp_Var4 = &_PDCLIB_filelist;
  while (p_Var1 = *pp_Var4, p_Var1 != (_PDCLIB_file_t *)0x0) {
    if (p_Var1->filename != (char *)0x0) {
      iVar2 = strcmp(p_Var1->filename,__filename);
      if (iVar2 == 0) goto LAB_00103b4b;
    }
    pp_Var4 = &p_Var1->next;
  }
  iVar2 = unlink(__filename);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    piVar3 = _PDCLIB_errno_func();
    *piVar3 = iVar2;
LAB_00103b4b:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int remove( const char * pathname )
{
    int rc;
    struct _PDCLIB_file_t * current = _PDCLIB_filelist;

    while ( current != NULL )
    {
        if ( ( current->filename != NULL ) && ( strcmp( current->filename, pathname ) == 0 ) )
        {
            return EOF;
        }

        current = current->next;
    }

    if ( ( rc = unlink( pathname ) ) == -1 )
    {
        /* The 1:1 mapping in _PDCLIB_config.h ensures this works. */
        *_PDCLIB_errno_func() = errno;
    }

    return rc;
}